

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree-avl.c
# Opt level: O0

void pp_tree_avl_balance_insert(PTreeAVLNode *node,PTreeBaseNode **root)

{
  PTreeBaseNode *pPVar1;
  PTreeAVLNode *parent;
  PTreeBaseNode **root_local;
  PTreeAVLNode *node_local;
  
  root_local = (PTreeBaseNode **)node;
  do {
    pPVar1 = root_local[4];
    if (pPVar1 == (PTreeBaseNode *)0x0) {
      return;
    }
    if (pPVar1->left == (PTreeBaseNode_ *)root_local) {
      if (*(int *)&pPVar1[1].right == 1) {
        if (*(int *)(root_local + 5) == -1) {
          pp_tree_avl_rotate_left_right((PTreeAVLNode *)root_local,root);
          return;
        }
        pp_tree_avl_rotate_right((PTreeAVLNode *)root_local,root);
        return;
      }
      if (*(int *)&pPVar1[1].right == -1) {
        *(undefined4 *)&pPVar1[1].right = 0;
        return;
      }
      *(undefined4 *)&pPVar1[1].right = 1;
    }
    else {
      if (*(int *)&pPVar1[1].right == -1) {
        if (*(int *)(root_local + 5) == 1) {
          pp_tree_avl_rotate_right_left((PTreeAVLNode *)root_local,root);
          return;
        }
        pp_tree_avl_rotate_left((PTreeAVLNode *)root_local,root);
        return;
      }
      if (*(int *)&pPVar1[1].right == 1) {
        *(undefined4 *)&pPVar1[1].right = 0;
        return;
      }
      *(undefined4 *)&pPVar1[1].right = 0xffffffff;
    }
    root_local = &root_local[4]->left;
  } while( true );
}

Assistant:

static void
pp_tree_avl_balance_insert (PTreeAVLNode *node, PTreeBaseNode **root)
{
	PTreeAVLNode *parent;

	while (TRUE) {
		parent = node->parent;

		if (P_UNLIKELY (parent == NULL))
			break;

		if (parent->base.left == (PTreeBaseNode *) node) {
			if (parent->balance_factor == 1) {
				if (node->balance_factor == -1)
					/* Case 1: Left-right rotate
					 *
					 *      (5)             (4)
					 *      / \            /   \
					 *    (3)  A   -->   (3)    (5)
					 *    / \            / \    / \
					 *   B  (4)         B   C  D   A
					 *      / \
					 *     C   D
					 */
					pp_tree_avl_rotate_left_right (node, root);
				else
					/* Case 2: Right rotate
					 *
					 *        (5)             (4)
					 *        / \            /   \
					 *      (4)  A   -->   (3)    (5)
					 *      / \            / \    / \
					 *    (3)  B          C   D  B   A
					 *    / \
					 *   C   D
					 */
					pp_tree_avl_rotate_right (node, root);

				break;
			} else if (parent->balance_factor == -1) {
				/* Case 3: Increase parent balance factor */
				parent->balance_factor = 0;
				break;
			} else
				/* Case 4: Increase parent balance factor */
				parent->balance_factor = 1;
		} else {
			if (parent->balance_factor == -1) {
				if (node->balance_factor == 1)
					/* Case 1: Right-left rotate
					 *
					 *    (3)               (4)
					 *    / \              /   \
					 *   A  (5)    -->   (3)    (5)
					 *      / \          / \    / \
					 *    (4)  B        A   C  D   B
					 *    / \
					 *   C   D
					 */
					pp_tree_avl_rotate_right_left (node, root);
				else
					/* Case 2: Left rotate
					 *
					 *    (3)              (4)
					 *    / \             /   \
					 *   A  (4)   -->   (3)    (5)
					 *      / \         / \    / \
					 *     B  (5)      A   B  C   D
					 *        / \
					 *       C   D
					 */
					pp_tree_avl_rotate_left (node, root);

				break;
			} else if (parent->balance_factor == 1) {
				/* Case 3: Decrease parent balance factor */
				parent->balance_factor = 0;
				break;
			} else
				/* Case 4: Decrease parent balance factor */
				parent->balance_factor = -1;
		}

		node = node->parent;
	}
}